

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

long Pa_GetStreamReadAvailable(PaStream *stream)

{
  PaError PVar1;
  undefined8 local_20;
  long result;
  PaError error;
  PaStream *stream_local;
  
  PVar1 = PaUtil_ValidateStreamPointer(stream);
  if (PVar1 == 0) {
    local_20 = (**(code **)(*(long *)((long)stream + 0x10) + 0x50))(stream);
  }
  else {
    local_20 = 0;
  }
  return local_20;
}

Assistant:

signed long Pa_GetStreamReadAvailable( PaStream* stream )
{
    PaError error = PaUtil_ValidateStreamPointer( stream );
    signed long result;

    PA_LOGAPI_ENTER_PARAMS( "Pa_GetStreamReadAvailable" );
    PA_LOGAPI(("\tPaStream* stream: 0x%p\n", stream ));

    if( error != paNoError )
    {
        result = 0;

        PA_LOGAPI(("Pa_GetStreamReadAvailable returned:\n" ));
        PA_LOGAPI(("\tunsigned long: 0 [ PaError error: %d ( %s ) ]\n", error, Pa_GetErrorText( error ) ));

    }
    else
    {
        result = PA_STREAM_INTERFACE(stream)->GetReadAvailable( stream );

        PA_LOGAPI(("Pa_GetStreamReadAvailable returned:\n" ));
        PA_LOGAPI(("\tPaError: %d ( %s )\n", result, Pa_GetErrorText( result ) ));

    }

    return result;
}